

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basics_gen.c
# Opt level: O0

GDBusObjectManager *
object_manager_client_new_for_bus_sync
          (GBusType bus_type,GDBusObjectManagerClientFlags flags,gchar *name,gchar *object_path,
          GCancellable *cancellable,GError **error)

{
  GType GVar1;
  long lVar2;
  undefined8 uVar3;
  GInitable *ret;
  GError **error_local;
  GCancellable *cancellable_local;
  gchar *object_path_local;
  gchar *name_local;
  GDBusObjectManagerClientFlags flags_local;
  GBusType bus_type_local;
  
  GVar1 = object_manager_client_get_type();
  lVar2 = g_initable_new(GVar1,cancellable,error,"flags",flags,"name",name,"bus-type",bus_type,
                         "object-path",object_path,"get-proxy-type-func",
                         object_manager_client_get_proxy_type,0);
  if (lVar2 == 0) {
    _flags_local = (GDBusObjectManager *)0x0;
  }
  else {
    uVar3 = g_dbus_object_manager_get_type();
    _flags_local = (GDBusObjectManager *)g_type_check_instance_cast(lVar2,uVar3);
  }
  return _flags_local;
}

Assistant:

GDBusObjectManager *
object_manager_client_new_for_bus_sync (
    GBusType                bus_type,
    GDBusObjectManagerClientFlags  flags,
    const gchar            *name,
    const gchar            *object_path,
    GCancellable           *cancellable,
    GError                **error)
{
  GInitable *ret;
  ret = g_initable_new (TYPE_OBJECT_MANAGER_CLIENT, cancellable, error, "flags", flags, "name", name, "bus-type", bus_type, "object-path", object_path, "get-proxy-type-func", object_manager_client_get_proxy_type, NULL);
  if (ret != NULL)
    return G_DBUS_OBJECT_MANAGER (ret);
  else
    return NULL;
}